

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O0

adios2_varinfo *
adios2_inquire_blockinfo(adios2_engine *engine,adios2_variable *variable,size_t step)

{
  int64_t *piVar1;
  ulong uVar2;
  ulong uVar3;
  adios2_blockinfo *paVar4;
  void *pvVar5;
  DataType DVar6;
  long *plVar7;
  DataType DVar8;
  DataType DVar9;
  size_type sVar10;
  adios2_blockinfo *paVar11;
  size_t *psVar12;
  reference pvVar13;
  const_reference pvVar14;
  int64_t iVar15;
  const_reference pvVar16;
  const_reference pvVar17;
  const_reference pvVar18;
  const_reference pvVar19;
  const_reference pvVar20;
  const_reference pvVar21;
  const_reference pvVar22;
  const_reference pvVar23;
  const_reference pvVar24;
  const_reference pvVar25;
  const_reference pvVar26;
  const_reference pvVar27;
  const_reference pvVar28;
  const_reference pvVar29;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t i_15;
  adios2_blockinfo *b_15;
  vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
  blocksInfo_14;
  size_t i_14;
  adios2_blockinfo *b_14;
  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
  blocksInfo_13;
  size_t i_13;
  adios2_blockinfo *b_13;
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  blocksInfo_12;
  size_t i_12;
  adios2_blockinfo *b_12;
  vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
  blocksInfo_11;
  size_t i_11;
  adios2_blockinfo *b_11;
  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
  blocksInfo_10;
  size_t i_10;
  adios2_blockinfo *b_10;
  vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
  blocksInfo_9;
  size_t i_9;
  adios2_blockinfo *b_9;
  vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
  blocksInfo_8;
  size_t i_8;
  adios2_blockinfo *b_8;
  vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
  blocksInfo_7;
  size_t i_7;
  adios2_blockinfo *b_7;
  vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
  blocksInfo_6;
  size_t i_6;
  adios2_blockinfo *b_6;
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  blocksInfo_5;
  size_t i_5;
  adios2_blockinfo *b_5;
  vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
  blocksInfo_4;
  size_t i_4;
  adios2_blockinfo *b_4;
  vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
  blocksInfo_3;
  size_t i_3;
  adios2_blockinfo *b_3;
  vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
  blocksInfo_2;
  size_t i_2;
  adios2_blockinfo *b_2;
  vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
  blocksInfo_1;
  size_t i_1;
  adios2_blockinfo *b_1;
  vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
  blocksInfo;
  size_t i;
  adios2_blockinfo *b;
  MinVarInfo *minBlocksInfo;
  DataType type;
  VariableBase *variableBase;
  Engine *engineCpp;
  adios2_varinfo *varinfo;
  anon_class_1_0_00000001 lf_CopyDims;
  vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
  *in_stack_fffffffffffff7c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff7c8;
  anon_class_1_0_00000001 *in_stack_fffffffffffff7d0;
  vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
  *this;
  string *in_stack_fffffffffffff868;
  adios2_variable *in_stack_fffffffffffff870;
  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
  *this_00;
  ulong local_318;
  Variable local_308 [24];
  ulong local_2f0;
  adios2_blockinfo *local_2e8;
  Variable local_2e0 [24];
  ulong local_2c8;
  adios2_blockinfo *local_2c0;
  Variable local_2b8 [24];
  ulong local_2a0;
  adios2_blockinfo *local_298;
  Variable local_290 [24];
  ulong local_278;
  adios2_blockinfo *local_270;
  Variable local_268 [24];
  ulong local_250;
  adios2_blockinfo *local_248;
  Variable local_240 [24];
  ulong local_228;
  adios2_blockinfo *local_220;
  Variable local_218 [24];
  ulong local_200;
  adios2_blockinfo *local_1f8;
  Variable local_1f0 [24];
  ulong local_1d8;
  adios2_blockinfo *local_1d0;
  Variable local_1c8 [24];
  ulong local_1b0;
  adios2_blockinfo *local_1a8;
  Variable local_1a0 [24];
  ulong local_188;
  adios2_blockinfo *local_180;
  Variable local_178 [24];
  ulong local_160;
  adios2_blockinfo *local_158;
  Variable local_150 [24];
  ulong local_138;
  adios2_blockinfo *local_130;
  Variable local_128 [24];
  ulong local_110;
  adios2_blockinfo *local_108;
  Variable local_100 [24];
  ulong local_e8;
  adios2_blockinfo *local_e0;
  Variable local_d8 [24];
  ulong local_c0;
  adios2_blockinfo *local_b8;
  void *local_b0;
  DataType local_a4;
  long local_a0;
  allocator local_91;
  string local_90 [32];
  long *local_70;
  allocator local_51;
  string local_50 [32];
  adios2_varinfo *local_30;
  undefined8 local_20;
  long local_18;
  long *local_10;
  adios2_varinfo *local_8;
  
  local_30 = (adios2_varinfo *)0x0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,"for adios2_engine, in call to adios2_inquire_blockinfo",&local_51);
  adios2::helper::CheckForNullptr<adios2_engine>
            ((adios2_engine *)in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_70 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"for adios2_variable, in call to adios2_get",&local_91);
  adios2::helper::CheckForNullptr<adios2_variable>
            (in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_a0 = local_18;
  local_a4 = *(DataType *)(local_18 + 0x28);
  local_b0 = (void *)(**(code **)(*local_70 + 0x58))(local_70,local_18,local_20);
  DVar6 = local_a4;
  if (local_b0 == (void *)0x0) {
    if (local_a4 == Struct) {
      local_8 = local_30;
    }
    else {
      DVar8 = adios2::helper::GetDataType<std::__cxx11::string>();
      plVar7 = local_70;
      DVar9 = local_a4;
      if (DVar6 == DVar8) {
        if (local_a0 != 0) {
          __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                         &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
        }
        adios2::core::Engine::BlocksInfo<std::__cxx11::string>(local_d8,(ulong)plVar7);
        local_30 = (adios2_varinfo *)malloc(0x28);
        sVar10 = std::
                 vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                 ::size((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                         *)local_d8);
        local_30->nblocks = sVar10;
        paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
        local_30->BlocksInfo = paVar11;
        local_e0 = local_30->BlocksInfo;
        pvVar14 = std::
                  vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                  ::operator[]((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                                *)local_d8,0);
        sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pvVar14->Shape);
        local_30->Dims = (int)sVar10;
        std::
        vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
        ::operator[]((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                      *)local_d8,0);
        psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
        local_30->Shape = psVar12;
        pvVar14 = std::
                  vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                  ::operator[]((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                                *)local_d8,0);
        local_30->IsValue = (uint)(pvVar14->IsValue & 1);
        pvVar14 = std::
                  vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                  ::operator[]((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                                *)local_d8,0);
        local_30->IsReverseDims = (uint)(pvVar14->IsReverseDims & 1);
        for (local_e8 = 0; local_e8 < local_30->nblocks; local_e8 = local_e8 + 1) {
          pvVar14 = std::
                    vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                    ::operator[]((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                                  *)local_d8,local_e8);
          local_e0[local_e8].WriterID = pvVar14->WriterID;
          pvVar14 = std::
                    vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                    ::operator[]((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                                  *)local_d8,local_e8);
          local_e0[local_e8].BlockID = pvVar14->BlockID;
          std::
          vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
          ::operator[]((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                        *)local_d8,local_e8);
          psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                              (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
          local_e0[local_e8].Start = psVar12;
          std::
          vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
          ::operator[]((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                        *)local_d8,local_e8);
          psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                              (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
          local_e0[local_e8].Count = psVar12;
          local_e0[local_e8].MinUnion.int64 = 0;
          local_e0[local_e8].MaxUnion.int64 = 0;
          std::
          vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
          ::operator[]((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                        *)local_d8,local_e8);
          iVar15 = std::__cxx11::string::data();
          local_e0[local_e8].Value.int64 = iVar15;
        }
        std::
        vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
        ::~vector((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                   *)in_stack_fffffffffffff7c0);
      }
      else {
        DVar8 = adios2::helper::GetDataType<char>();
        plVar7 = local_70;
        DVar6 = local_a4;
        if (DVar9 == DVar8) {
          if (local_a0 != 0) {
            __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                           &adios2::core::Variable<char>::typeinfo,0);
          }
          adios2::core::Engine::BlocksInfo<char>(local_100,(ulong)plVar7);
          local_30 = (adios2_varinfo *)malloc(0x28);
          sVar10 = std::
                   vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                   ::size((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                           *)local_100);
          local_30->nblocks = sVar10;
          paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
          local_30->BlocksInfo = paVar11;
          local_108 = local_30->BlocksInfo;
          pvVar16 = std::
                    vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                    ::operator[]((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                                  *)local_100,0);
          sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pvVar16->Shape)
          ;
          local_30->Dims = (int)sVar10;
          std::
          vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
          ::operator[]((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                        *)local_100,0);
          psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                              (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
          local_30->Shape = psVar12;
          pvVar16 = std::
                    vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                    ::operator[]((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                                  *)local_100,0);
          local_30->IsValue = (uint)(pvVar16->IsValue & 1);
          pvVar16 = std::
                    vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                    ::operator[]((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                                  *)local_100,0);
          local_30->IsReverseDims = (uint)(pvVar16->IsReverseDims & 1);
          for (local_110 = 0; local_110 < local_30->nblocks; local_110 = local_110 + 1) {
            pvVar16 = std::
                      vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                      ::operator[]((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                                    *)local_100,local_110);
            local_108[local_110].WriterID = pvVar16->WriterID;
            pvVar16 = std::
                      vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                      ::operator[]((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                                    *)local_100,local_110);
            local_108[local_110].BlockID = pvVar16->BlockID;
            std::
            vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
            ::operator[]((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                          *)local_100,local_110);
            psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
            local_108[local_110].Start = psVar12;
            std::
            vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
            ::operator[]((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                          *)local_100,local_110);
            psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
            local_108[local_110].Count = psVar12;
            local_108[local_110].MinUnion.int64 = 0;
            local_108[local_110].MaxUnion.int64 = 0;
            local_108[local_110].Value.int64 = 0;
          }
          std::
          vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
          ::~vector((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                     *)in_stack_fffffffffffff7c0);
        }
        else {
          DVar8 = adios2::helper::GetDataType<signed_char>();
          plVar7 = local_70;
          DVar9 = local_a4;
          if (DVar6 == DVar8) {
            if (local_a0 != 0) {
              __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<signed_char>::typeinfo,0);
            }
            adios2::core::Engine::BlocksInfo<signed_char>(local_128,(ulong)plVar7);
            local_30 = (adios2_varinfo *)malloc(0x28);
            sVar10 = std::
                     vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                     ::size((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                             *)local_128);
            local_30->nblocks = sVar10;
            paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
            local_30->BlocksInfo = paVar11;
            local_130 = local_30->BlocksInfo;
            pvVar17 = std::
                      vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                      ::operator[]((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                                    *)local_128,0);
            sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                               (&pvVar17->Shape);
            local_30->Dims = (int)sVar10;
            std::
            vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
            ::operator[]((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                          *)local_128,0);
            psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
            local_30->Shape = psVar12;
            pvVar17 = std::
                      vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                      ::operator[]((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                                    *)local_128,0);
            local_30->IsValue = (uint)(pvVar17->IsValue & 1);
            pvVar17 = std::
                      vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                      ::operator[]((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                                    *)local_128,0);
            local_30->IsReverseDims = (uint)(pvVar17->IsReverseDims & 1);
            for (local_138 = 0; local_138 < local_30->nblocks; local_138 = local_138 + 1) {
              pvVar17 = std::
                        vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                        ::operator[]((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                                      *)local_128,local_138);
              local_130[local_138].WriterID = pvVar17->WriterID;
              pvVar17 = std::
                        vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                        ::operator[]((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                                      *)local_128,local_138);
              local_130[local_138].BlockID = pvVar17->BlockID;
              std::
              vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
              ::operator[]((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                            *)local_128,local_138);
              psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                  (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
              local_130[local_138].Start = psVar12;
              std::
              vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
              ::operator[]((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                            *)local_128,local_138);
              psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                  (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
              local_130[local_138].Count = psVar12;
              local_130[local_138].MinUnion.int64 = 0;
              local_130[local_138].MaxUnion.int64 = 0;
              local_130[local_138].Value.int64 = 0;
            }
            std::
            vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
            ::~vector((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                       *)in_stack_fffffffffffff7c0);
          }
          else {
            DVar8 = adios2::helper::GetDataType<short>();
            plVar7 = local_70;
            DVar6 = local_a4;
            if (DVar9 == DVar8) {
              if (local_a0 != 0) {
                __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                               &adios2::core::Variable<short>::typeinfo,0);
              }
              adios2::core::Engine::BlocksInfo<short>(local_150,(ulong)plVar7);
              local_30 = (adios2_varinfo *)malloc(0x28);
              sVar10 = std::
                       vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                       ::size((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                               *)local_150);
              local_30->nblocks = sVar10;
              paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
              local_30->BlocksInfo = paVar11;
              local_158 = local_30->BlocksInfo;
              pvVar18 = std::
                        vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                        ::operator[]((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                                      *)local_150,0);
              sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                 (&pvVar18->Shape);
              local_30->Dims = (int)sVar10;
              std::
              vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
              ::operator[]((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                            *)local_150,0);
              psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                  (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
              local_30->Shape = psVar12;
              pvVar18 = std::
                        vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                        ::operator[]((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                                      *)local_150,0);
              local_30->IsValue = (uint)(pvVar18->IsValue & 1);
              pvVar18 = std::
                        vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                        ::operator[]((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                                      *)local_150,0);
              local_30->IsReverseDims = (uint)(pvVar18->IsReverseDims & 1);
              for (local_160 = 0; local_160 < local_30->nblocks; local_160 = local_160 + 1) {
                pvVar18 = std::
                          vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                          ::operator[]((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                                        *)local_150,local_160);
                local_158[local_160].WriterID = pvVar18->WriterID;
                pvVar18 = std::
                          vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                          ::operator[]((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                                        *)local_150,local_160);
                local_158[local_160].BlockID = pvVar18->BlockID;
                std::
                vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                ::operator[]((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                              *)local_150,local_160);
                psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                    (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                local_158[local_160].Start = psVar12;
                std::
                vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                ::operator[]((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                              *)local_150,local_160);
                psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                    (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                local_158[local_160].Count = psVar12;
                local_158[local_160].MinUnion.int64 = 0;
                local_158[local_160].MaxUnion.int64 = 0;
                local_158[local_160].Value.int64 = 0;
              }
              std::
              vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
              ::~vector((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                         *)in_stack_fffffffffffff7c0);
            }
            else {
              DVar8 = adios2::helper::GetDataType<int>();
              plVar7 = local_70;
              DVar9 = local_a4;
              if (DVar6 == DVar8) {
                if (local_a0 != 0) {
                  __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                                 &adios2::core::Variable<int>::typeinfo,0);
                }
                adios2::core::Engine::BlocksInfo<int>(local_178,(ulong)plVar7);
                local_30 = (adios2_varinfo *)malloc(0x28);
                sVar10 = std::
                         vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                         ::size((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                                 *)local_178);
                local_30->nblocks = sVar10;
                paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
                local_30->BlocksInfo = paVar11;
                local_180 = local_30->BlocksInfo;
                pvVar19 = std::
                          vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                          ::operator[]((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                                        *)local_178,0);
                sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                   (&pvVar19->Shape);
                local_30->Dims = (int)sVar10;
                std::
                vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                ::operator[]((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                              *)local_178,0);
                psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                    (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                local_30->Shape = psVar12;
                pvVar19 = std::
                          vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                          ::operator[]((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                                        *)local_178,0);
                local_30->IsValue = (uint)(pvVar19->IsValue & 1);
                pvVar19 = std::
                          vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                          ::operator[]((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                                        *)local_178,0);
                local_30->IsReverseDims = (uint)(pvVar19->IsReverseDims & 1);
                for (local_188 = 0; local_188 < local_30->nblocks; local_188 = local_188 + 1) {
                  pvVar19 = std::
                            vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                            ::operator[]((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                                          *)local_178,local_188);
                  local_180[local_188].WriterID = pvVar19->WriterID;
                  pvVar19 = std::
                            vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                            ::operator[]((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                                          *)local_178,local_188);
                  local_180[local_188].BlockID = pvVar19->BlockID;
                  std::
                  vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                  ::operator[]((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                                *)local_178,local_188);
                  psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                      (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                  local_180[local_188].Start = psVar12;
                  std::
                  vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                  ::operator[]((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                                *)local_178,local_188);
                  psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                      (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                  local_180[local_188].Count = psVar12;
                  local_180[local_188].MinUnion.int64 = 0;
                  local_180[local_188].MaxUnion.int64 = 0;
                  local_180[local_188].Value.int64 = 0;
                }
                std::
                vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                ::~vector((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
                           *)in_stack_fffffffffffff7c0);
              }
              else {
                DVar8 = adios2::helper::GetDataType<long>();
                plVar7 = local_70;
                DVar6 = local_a4;
                if (DVar9 == DVar8) {
                  if (local_a0 != 0) {
                    __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                                   &adios2::core::Variable<long>::typeinfo,0);
                  }
                  adios2::core::Engine::BlocksInfo<long>(local_1a0,(ulong)plVar7);
                  local_30 = (adios2_varinfo *)malloc(0x28);
                  sVar10 = std::
                           vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                           ::size((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                   *)local_1a0);
                  local_30->nblocks = sVar10;
                  paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
                  local_30->BlocksInfo = paVar11;
                  local_1a8 = local_30->BlocksInfo;
                  pvVar20 = std::
                            vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                            ::operator[]((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                          *)local_1a0,0);
                  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                     (&pvVar20->Shape);
                  local_30->Dims = (int)sVar10;
                  std::
                  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                  ::operator[]((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                *)local_1a0,0);
                  psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                      (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                  local_30->Shape = psVar12;
                  pvVar20 = std::
                            vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                            ::operator[]((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                          *)local_1a0,0);
                  local_30->IsValue = (uint)(pvVar20->IsValue & 1);
                  pvVar20 = std::
                            vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                            ::operator[]((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                          *)local_1a0,0);
                  local_30->IsReverseDims = (uint)(pvVar20->IsReverseDims & 1);
                  for (local_1b0 = 0; local_1b0 < local_30->nblocks; local_1b0 = local_1b0 + 1) {
                    pvVar20 = std::
                              vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                              ::operator[]((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                            *)local_1a0,local_1b0);
                    local_1a8[local_1b0].WriterID = pvVar20->WriterID;
                    pvVar20 = std::
                              vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                              ::operator[]((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                            *)local_1a0,local_1b0);
                    local_1a8[local_1b0].BlockID = pvVar20->BlockID;
                    std::
                    vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                    ::operator[]((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                  *)local_1a0,local_1b0);
                    psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                        (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                    local_1a8[local_1b0].Start = psVar12;
                    std::
                    vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                    ::operator[]((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                                  *)local_1a0,local_1b0);
                    psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                        (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                    local_1a8[local_1b0].Count = psVar12;
                    local_1a8[local_1b0].MinUnion.int64 = 0;
                    local_1a8[local_1b0].MaxUnion.int64 = 0;
                    local_1a8[local_1b0].Value.int64 = 0;
                  }
                  std::
                  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                  ::~vector((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                             *)in_stack_fffffffffffff7c0);
                }
                else {
                  DVar8 = adios2::helper::GetDataType<unsigned_char>();
                  plVar7 = local_70;
                  DVar9 = local_a4;
                  if (DVar6 == DVar8) {
                    if (local_a0 != 0) {
                      __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_char>::typeinfo,0);
                    }
                    adios2::core::Engine::BlocksInfo<unsigned_char>(local_1c8,(ulong)plVar7);
                    local_30 = (adios2_varinfo *)malloc(0x28);
                    sVar10 = std::
                             vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                             ::size((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                     *)local_1c8);
                    local_30->nblocks = sVar10;
                    paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
                    local_30->BlocksInfo = paVar11;
                    local_1d0 = local_30->BlocksInfo;
                    pvVar21 = std::
                              vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                              ::operator[]((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                            *)local_1c8,0);
                    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                       (&pvVar21->Shape);
                    local_30->Dims = (int)sVar10;
                    std::
                    vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                    ::operator[]((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                  *)local_1c8,0);
                    psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                        (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                    local_30->Shape = psVar12;
                    pvVar21 = std::
                              vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                              ::operator[]((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                            *)local_1c8,0);
                    local_30->IsValue = (uint)(pvVar21->IsValue & 1);
                    pvVar21 = std::
                              vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                              ::operator[]((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                            *)local_1c8,0);
                    local_30->IsReverseDims = (uint)(pvVar21->IsReverseDims & 1);
                    for (local_1d8 = 0; local_1d8 < local_30->nblocks; local_1d8 = local_1d8 + 1) {
                      pvVar21 = std::
                                vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                ::operator[]((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                              *)local_1c8,local_1d8);
                      local_1d0[local_1d8].WriterID = pvVar21->WriterID;
                      pvVar21 = std::
                                vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                ::operator[]((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                              *)local_1c8,local_1d8);
                      local_1d0[local_1d8].BlockID = pvVar21->BlockID;
                      std::
                      vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                      ::operator[]((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                    *)local_1c8,local_1d8);
                      psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                          (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                      local_1d0[local_1d8].Start = psVar12;
                      std::
                      vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                      ::operator[]((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                                    *)local_1c8,local_1d8);
                      psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                          (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                      local_1d0[local_1d8].Count = psVar12;
                      local_1d0[local_1d8].MinUnion.int64 = 0;
                      local_1d0[local_1d8].MaxUnion.int64 = 0;
                      local_1d0[local_1d8].Value.int64 = 0;
                    }
                    std::
                    vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                    ::~vector((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                               *)in_stack_fffffffffffff7c0);
                  }
                  else {
                    DVar8 = adios2::helper::GetDataType<unsigned_short>();
                    plVar7 = local_70;
                    DVar6 = local_a4;
                    if (DVar9 == DVar8) {
                      if (local_a0 != 0) {
                        __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                                       &adios2::core::Variable<unsigned_short>::typeinfo,0);
                      }
                      adios2::core::Engine::BlocksInfo<unsigned_short>(local_1f0,(ulong)plVar7);
                      local_30 = (adios2_varinfo *)malloc(0x28);
                      sVar10 = std::
                               vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                               ::size((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                       *)local_1f0);
                      local_30->nblocks = sVar10;
                      paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
                      local_30->BlocksInfo = paVar11;
                      local_1f8 = local_30->BlocksInfo;
                      pvVar22 = std::
                                vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                ::operator[]((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                              *)local_1f0,0);
                      sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                         (&pvVar22->Shape);
                      local_30->Dims = (int)sVar10;
                      std::
                      vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                      ::operator[]((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                    *)local_1f0,0);
                      psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                          (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                      local_30->Shape = psVar12;
                      pvVar22 = std::
                                vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                ::operator[]((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                              *)local_1f0,0);
                      local_30->IsValue = (uint)(pvVar22->IsValue & 1);
                      pvVar22 = std::
                                vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                ::operator[]((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                              *)local_1f0,0);
                      local_30->IsReverseDims = (uint)(pvVar22->IsReverseDims & 1);
                      for (local_200 = 0; local_200 < local_30->nblocks; local_200 = local_200 + 1)
                      {
                        pvVar22 = std::
                                  vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                  ::operator[]((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                                *)local_1f0,local_200);
                        local_1f8[local_200].WriterID = pvVar22->WriterID;
                        pvVar22 = std::
                                  vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                  ::operator[]((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                                *)local_1f0,local_200);
                        local_1f8[local_200].BlockID = pvVar22->BlockID;
                        std::
                        vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                        ::operator[]((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                      *)local_1f0,local_200);
                        psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                        local_1f8[local_200].Start = psVar12;
                        std::
                        vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                        ::operator[]((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                      *)local_1f0,local_200);
                        psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                        local_1f8[local_200].Count = psVar12;
                        local_1f8[local_200].MinUnion.int64 = 0;
                        local_1f8[local_200].MaxUnion.int64 = 0;
                        local_1f8[local_200].Value.int64 = 0;
                      }
                      std::
                      vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                      ::~vector((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                                 *)in_stack_fffffffffffff7c0);
                    }
                    else {
                      DVar8 = adios2::helper::GetDataType<unsigned_int>();
                      plVar7 = local_70;
                      DVar9 = local_a4;
                      if (DVar6 == DVar8) {
                        if (local_a0 != 0) {
                          __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                                         &adios2::core::Variable<unsigned_int>::typeinfo,0);
                        }
                        adios2::core::Engine::BlocksInfo<unsigned_int>(local_218,(ulong)plVar7);
                        local_30 = (adios2_varinfo *)malloc(0x28);
                        sVar10 = std::
                                 vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                 ::size((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                         *)local_218);
                        local_30->nblocks = sVar10;
                        paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
                        local_30->BlocksInfo = paVar11;
                        local_220 = local_30->BlocksInfo;
                        pvVar23 = std::
                                  vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                  ::operator[]((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                                *)local_218,0);
                        sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                           (&pvVar23->Shape);
                        local_30->Dims = (int)sVar10;
                        std::
                        vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                        ::operator[]((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                      *)local_218,0);
                        psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                        local_30->Shape = psVar12;
                        pvVar23 = std::
                                  vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                  ::operator[]((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                                *)local_218,0);
                        local_30->IsValue = (uint)(pvVar23->IsValue & 1);
                        pvVar23 = std::
                                  vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                  ::operator[]((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                                *)local_218,0);
                        local_30->IsReverseDims = (uint)(pvVar23->IsReverseDims & 1);
                        for (local_228 = 0; local_228 < local_30->nblocks; local_228 = local_228 + 1
                            ) {
                          pvVar23 = std::
                                    vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                    ::operator[]((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                                  *)local_218,local_228);
                          local_220[local_228].WriterID = pvVar23->WriterID;
                          pvVar23 = std::
                                    vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                    ::operator[]((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                                  *)local_218,local_228);
                          local_220[local_228].BlockID = pvVar23->BlockID;
                          std::
                          vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                          ::operator[]((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                        *)local_218,local_228);
                          psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                              (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                          local_220[local_228].Start = psVar12;
                          std::
                          vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                          ::operator[]((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                        *)local_218,local_228);
                          psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                              (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                          local_220[local_228].Count = psVar12;
                          local_220[local_228].MinUnion.int64 = 0;
                          local_220[local_228].MaxUnion.int64 = 0;
                          local_220[local_228].Value.int64 = 0;
                        }
                        std::
                        vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                        ::~vector((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                                   *)in_stack_fffffffffffff7c0);
                      }
                      else {
                        DVar8 = adios2::helper::GetDataType<unsigned_long>();
                        plVar7 = local_70;
                        DVar6 = local_a4;
                        if (DVar9 == DVar8) {
                          if (local_a0 != 0) {
                            __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                                           &adios2::core::Variable<unsigned_long>::typeinfo,0);
                          }
                          adios2::core::Engine::BlocksInfo<unsigned_long>(local_240,(ulong)plVar7);
                          local_30 = (adios2_varinfo *)malloc(0x28);
                          sVar10 = std::
                                   vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                   ::size((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                           *)local_240);
                          local_30->nblocks = sVar10;
                          paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
                          local_30->BlocksInfo = paVar11;
                          local_248 = local_30->BlocksInfo;
                          pvVar24 = std::
                                    vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                    ::operator[]((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                                  *)local_240,0);
                          sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                             (&pvVar24->Shape);
                          local_30->Dims = (int)sVar10;
                          std::
                          vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                          ::operator[]((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                        *)local_240,0);
                          psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                              (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
                          local_30->Shape = psVar12;
                          pvVar24 = std::
                                    vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                    ::operator[]((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                                  *)local_240,0);
                          local_30->IsValue = (uint)(pvVar24->IsValue & 1);
                          pvVar24 = std::
                                    vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                    ::operator[]((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                                  *)local_240,0);
                          local_30->IsReverseDims = (uint)(pvVar24->IsReverseDims & 1);
                          for (local_250 = 0; local_250 < local_30->nblocks;
                              local_250 = local_250 + 1) {
                            pvVar24 = std::
                                      vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                      ::operator[]((
                                                  vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                                  *)local_240,local_250);
                            local_248[local_250].WriterID = pvVar24->WriterID;
                            pvVar24 = std::
                                      vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                      ::operator[]((
                                                  vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                                  *)local_240,local_250);
                            local_248[local_250].BlockID = pvVar24->BlockID;
                            std::
                            vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                            ::operator[]((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                          *)local_240,local_250);
                            psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                                (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8
                                                );
                            local_248[local_250].Start = psVar12;
                            std::
                            vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                            ::operator[]((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                          *)local_240,local_250);
                            psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                                (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8
                                                );
                            local_248[local_250].Count = psVar12;
                            local_248[local_250].MinUnion.int64 = 0;
                            local_248[local_250].MaxUnion.int64 = 0;
                            local_248[local_250].Value.int64 = 0;
                          }
                          std::
                          vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                          ::~vector((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                                     *)in_stack_fffffffffffff7c0);
                        }
                        else {
                          DVar8 = adios2::helper::GetDataType<float>();
                          plVar7 = local_70;
                          DVar9 = local_a4;
                          if (DVar6 == DVar8) {
                            if (local_a0 != 0) {
                              __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                                             &adios2::core::Variable<float>::typeinfo,0);
                            }
                            adios2::core::Engine::BlocksInfo<float>(local_268,(ulong)plVar7);
                            local_30 = (adios2_varinfo *)malloc(0x28);
                            sVar10 = std::
                                     vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                     ::size((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                             *)local_268);
                            local_30->nblocks = sVar10;
                            paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
                            local_30->BlocksInfo = paVar11;
                            local_270 = local_30->BlocksInfo;
                            pvVar25 = std::
                                      vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                      ::operator[]((
                                                  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                                  *)local_268,0);
                            sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                     size(&pvVar25->Shape);
                            local_30->Dims = (int)sVar10;
                            std::
                            vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                            ::operator[]((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                          *)local_268,0);
                            psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::operator()
                                                (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8
                                                );
                            local_30->Shape = psVar12;
                            pvVar25 = std::
                                      vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                      ::operator[]((
                                                  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                                  *)local_268,0);
                            local_30->IsValue = (uint)(pvVar25->IsValue & 1);
                            pvVar25 = std::
                                      vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                      ::operator[]((
                                                  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                                  *)local_268,0);
                            local_30->IsReverseDims = (uint)(pvVar25->IsReverseDims & 1);
                            for (local_278 = 0; local_278 < local_30->nblocks;
                                local_278 = local_278 + 1) {
                              pvVar25 = std::
                                        vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                        ::operator[]((
                                                  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                                  *)local_268,local_278);
                              local_270[local_278].WriterID = pvVar25->WriterID;
                              pvVar25 = std::
                                        vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                        ::operator[]((
                                                  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                                  *)local_268,local_278);
                              local_270[local_278].BlockID = pvVar25->BlockID;
                              std::
                              vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                              ::operator[]((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                            *)local_268,local_278);
                              psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                        operator()(in_stack_fffffffffffff7d0,
                                                   in_stack_fffffffffffff7c8);
                              local_270[local_278].Start = psVar12;
                              std::
                              vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                              ::operator[]((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                            *)local_268,local_278);
                              psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                        operator()(in_stack_fffffffffffff7d0,
                                                   in_stack_fffffffffffff7c8);
                              local_270[local_278].Count = psVar12;
                              local_270[local_278].MinUnion.int64 = 0;
                              local_270[local_278].MaxUnion.int64 = 0;
                              local_270[local_278].Value.int64 = 0;
                            }
                            std::
                            vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                            ::~vector((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                                       *)in_stack_fffffffffffff7c0);
                          }
                          else {
                            DVar8 = adios2::helper::GetDataType<double>();
                            plVar7 = local_70;
                            DVar6 = local_a4;
                            if (DVar9 == DVar8) {
                              if (local_a0 != 0) {
                                __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                                               &adios2::core::Variable<double>::typeinfo,0);
                              }
                              adios2::core::Engine::BlocksInfo<double>(local_290,(ulong)plVar7);
                              local_30 = (adios2_varinfo *)malloc(0x28);
                              sVar10 = std::
                                       vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                       ::size((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                               *)local_290);
                              local_30->nblocks = sVar10;
                              paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
                              local_30->BlocksInfo = paVar11;
                              local_298 = local_30->BlocksInfo;
                              pvVar26 = std::
                                        vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                        ::operator[]((
                                                  vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                                  *)local_290,0);
                              sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                       size(&pvVar26->Shape);
                              local_30->Dims = (int)sVar10;
                              std::
                              vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                              ::operator[]((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                            *)local_290,0);
                              psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                        operator()(in_stack_fffffffffffff7d0,
                                                   in_stack_fffffffffffff7c8);
                              local_30->Shape = psVar12;
                              pvVar26 = std::
                                        vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                        ::operator[]((
                                                  vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                                  *)local_290,0);
                              local_30->IsValue = (uint)(pvVar26->IsValue & 1);
                              pvVar26 = std::
                                        vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                        ::operator[]((
                                                  vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                                  *)local_290,0);
                              local_30->IsReverseDims = (uint)(pvVar26->IsReverseDims & 1);
                              for (local_2a0 = 0; local_2a0 < local_30->nblocks;
                                  local_2a0 = local_2a0 + 1) {
                                pvVar26 = std::
                                          vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                          ::operator[]((
                                                  vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                                  *)local_290,local_2a0);
                                local_298[local_2a0].WriterID = pvVar26->WriterID;
                                pvVar26 = std::
                                          vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                          ::operator[]((
                                                  vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                                  *)local_290,local_2a0);
                                local_298[local_2a0].BlockID = pvVar26->BlockID;
                                std::
                                vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                ::operator[]((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                              *)local_290,local_2a0);
                                psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                          operator()(in_stack_fffffffffffff7d0,
                                                     in_stack_fffffffffffff7c8);
                                local_298[local_2a0].Start = psVar12;
                                std::
                                vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                ::operator[]((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                              *)local_290,local_2a0);
                                psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                          operator()(in_stack_fffffffffffff7d0,
                                                     in_stack_fffffffffffff7c8);
                                local_298[local_2a0].Count = psVar12;
                                local_298[local_2a0].MinUnion.int64 = 0;
                                local_298[local_2a0].MaxUnion.int64 = 0;
                                local_298[local_2a0].Value.int64 = 0;
                              }
                              std::
                              vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                              ::~vector((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                                         *)in_stack_fffffffffffff7c0);
                            }
                            else {
                              DVar8 = adios2::helper::GetDataType<long_double>();
                              plVar7 = local_70;
                              DVar9 = local_a4;
                              if (DVar6 == DVar8) {
                                if (local_a0 != 0) {
                                  __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                                                 &adios2::core::Variable<long_double>::typeinfo,0);
                                }
                                adios2::core::Engine::BlocksInfo<long_double>
                                          (local_2b8,(ulong)plVar7);
                                local_30 = (adios2_varinfo *)malloc(0x28);
                                this_00 = (vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                           *)local_2b8;
                                sVar10 = std::
                                         vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                         ::size(this_00);
                                local_30->nblocks = sVar10;
                                paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
                                local_30->BlocksInfo = paVar11;
                                local_2c0 = local_30->BlocksInfo;
                                pvVar27 = std::
                                          vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                          ::operator[](this_00,0);
                                sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                         ::size(&pvVar27->Shape);
                                local_30->Dims = (int)sVar10;
                                std::
                                vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                ::operator[](this_00,0);
                                psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                          operator()(in_stack_fffffffffffff7d0,
                                                     in_stack_fffffffffffff7c8);
                                local_30->Shape = psVar12;
                                pvVar27 = std::
                                          vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                          ::operator[]((
                                                  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                                  *)local_2b8,0);
                                local_30->IsValue = (uint)(pvVar27->IsValue & 1);
                                pvVar27 = std::
                                          vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                          ::operator[]((
                                                  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                                  *)local_2b8,0);
                                local_30->IsReverseDims = (uint)(pvVar27->IsReverseDims & 1);
                                for (local_2c8 = 0; local_2c8 < local_30->nblocks;
                                    local_2c8 = local_2c8 + 1) {
                                  pvVar27 = std::
                                            vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                            ::operator[]((
                                                  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                                  *)local_2b8,local_2c8);
                                  local_2c0[local_2c8].WriterID = pvVar27->WriterID;
                                  pvVar27 = std::
                                            vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                            ::operator[]((
                                                  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                                  *)local_2b8,local_2c8);
                                  local_2c0[local_2c8].BlockID = pvVar27->BlockID;
                                  std::
                                  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                  ::operator[]((vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                                *)local_2b8,local_2c8);
                                  psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                            operator()(in_stack_fffffffffffff7d0,
                                                       in_stack_fffffffffffff7c8);
                                  local_2c0[local_2c8].Start = psVar12;
                                  std::
                                  vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                  ::operator[]((vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                                *)local_2b8,local_2c8);
                                  psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                            operator()(in_stack_fffffffffffff7d0,
                                                       in_stack_fffffffffffff7c8);
                                  local_2c0[local_2c8].Count = psVar12;
                                  local_2c0[local_2c8].MinUnion.int64 = 0;
                                  local_2c0[local_2c8].MaxUnion.int64 = 0;
                                  local_2c0[local_2c8].Value.int64 = 0;
                                }
                                std::
                                vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                ::~vector((vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                                           *)in_stack_fffffffffffff7c0);
                              }
                              else {
                                DVar8 = adios2::helper::GetDataType<std::complex<float>>();
                                plVar7 = local_70;
                                DVar6 = local_a4;
                                if (DVar9 == DVar8) {
                                  if (local_a0 != 0) {
                                    __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                                                   &adios2::core::Variable<std::complex<float>>::
                                                    typeinfo,0);
                                  }
                                  adios2::core::Engine::BlocksInfo<std::complex<float>>
                                            (local_2e0,(ulong)plVar7);
                                  local_30 = (adios2_varinfo *)malloc(0x28);
                                  sVar10 = std::
                                           vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                           ::size((
                                                  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                  *)local_2e0);
                                  local_30->nblocks = sVar10;
                                  paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
                                  local_30->BlocksInfo = paVar11;
                                  local_2e8 = local_30->BlocksInfo;
                                  pvVar28 = std::
                                            vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                            ::operator[]((
                                                  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                  *)local_2e0,0);
                                  sVar10 = std::
                                           vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                           size(&pvVar28->Shape);
                                  local_30->Dims = (int)sVar10;
                                  std::
                                  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                  ::operator[]((vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                *)local_2e0,0);
                                  psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                            operator()(in_stack_fffffffffffff7d0,
                                                       in_stack_fffffffffffff7c8);
                                  local_30->Shape = psVar12;
                                  pvVar28 = std::
                                            vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                            ::operator[]((
                                                  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                  *)local_2e0,0);
                                  local_30->IsValue = (uint)(pvVar28->IsValue & 1);
                                  pvVar28 = std::
                                            vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                            ::operator[]((
                                                  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                  *)local_2e0,0);
                                  local_30->IsReverseDims = (uint)(pvVar28->IsReverseDims & 1);
                                  for (local_2f0 = 0; local_2f0 < local_30->nblocks;
                                      local_2f0 = local_2f0 + 1) {
                                    pvVar28 = std::
                                              vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                              ::operator[]((
                                                  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                  *)local_2e0,local_2f0);
                                    local_2e8[local_2f0].WriterID = pvVar28->WriterID;
                                    pvVar28 = std::
                                              vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                              ::operator[]((
                                                  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                  *)local_2e0,local_2f0);
                                    local_2e8[local_2f0].BlockID = pvVar28->BlockID;
                                    std::
                                    vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                    ::operator[]((vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                  *)local_2e0,local_2f0);
                                    psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                              operator()(in_stack_fffffffffffff7d0,
                                                         in_stack_fffffffffffff7c8);
                                    local_2e8[local_2f0].Start = psVar12;
                                    std::
                                    vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                    ::operator[]((vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                                  *)local_2e0,local_2f0);
                                    psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                              operator()(in_stack_fffffffffffff7d0,
                                                         in_stack_fffffffffffff7c8);
                                    local_2e8[local_2f0].Count = psVar12;
                                    local_2e8[local_2f0].MinUnion.int64 = 0;
                                    local_2e8[local_2f0].MaxUnion.int64 = 0;
                                    local_2e8[local_2f0].Value.int64 = 0;
                                  }
                                  std::
                                  vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                  ::~vector((vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                                             *)in_stack_fffffffffffff7c0);
                                }
                                else {
                                  DVar9 = adios2::helper::GetDataType<std::complex<double>>();
                                  plVar7 = local_70;
                                  if (DVar6 == DVar9) {
                                    if (local_a0 != 0) {
                                      __dynamic_cast(local_a0,&adios2::core::VariableBase::typeinfo,
                                                     &adios2::core::Variable<std::complex<double>>::
                                                      typeinfo,0);
                                    }
                                    adios2::core::Engine::BlocksInfo<std::complex<double>>
                                              (local_308,(ulong)plVar7);
                                    local_30 = (adios2_varinfo *)malloc(0x28);
                                    this = (vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                            *)local_308;
                                    sVar10 = std::
                                             vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                             ::size(this);
                                    local_30->nblocks = sVar10;
                                    paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
                                    local_30->BlocksInfo = paVar11;
                                    paVar11 = local_30->BlocksInfo;
                                    pvVar29 = std::
                                              vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                              ::operator[](this,0);
                                    sVar10 = std::
                                             vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                             size(&pvVar29->Shape);
                                    local_30->Dims = (int)sVar10;
                                    std::
                                    vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                    ::operator[](this,0);
                                    psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                              operator()((anon_class_1_0_00000001 *)this,
                                                         in_stack_fffffffffffff7c8);
                                    local_30->Shape = psVar12;
                                    pvVar29 = std::
                                              vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                              ::operator[]((
                                                  vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                                  *)local_308,0);
                                    local_30->IsValue = (uint)(pvVar29->IsValue & 1);
                                    pvVar29 = std::
                                              vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                              ::operator[]((
                                                  vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                                  *)local_308,0);
                                    local_30->IsReverseDims = (uint)(pvVar29->IsReverseDims & 1);
                                    for (local_318 = 0; local_318 < local_30->nblocks;
                                        local_318 = local_318 + 1) {
                                      in_stack_fffffffffffff7c0 =
                                           (vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                            *)local_308;
                                      pvVar29 = std::
                                                vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                                ::operator[](in_stack_fffffffffffff7c0,local_318);
                                      paVar11[local_318].WriterID = pvVar29->WriterID;
                                      pvVar29 = std::
                                                vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                                ::operator[](in_stack_fffffffffffff7c0,local_318);
                                      paVar11[local_318].BlockID = pvVar29->BlockID;
                                      std::
                                      vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                      ::operator[](in_stack_fffffffffffff7c0,local_318);
                                      in_stack_fffffffffffff7c8 =
                                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                           operator()((anon_class_1_0_00000001 *)this,
                                                      in_stack_fffffffffffff7c8);
                                      paVar11[local_318].Start = (size_t *)in_stack_fffffffffffff7c8
                                      ;
                                      std::
                                      vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                      ::operator[]((
                                                  vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                                  *)local_308,local_318);
                                      psVar12 = adios2_inquire_blockinfo::anon_class_1_0_00000001::
                                                operator()((anon_class_1_0_00000001 *)this,
                                                           in_stack_fffffffffffff7c8);
                                      paVar11[local_318].Count = psVar12;
                                      paVar11[local_318].MinUnion.int64 = 0;
                                      paVar11[local_318].MaxUnion.int64 = 0;
                                      paVar11[local_318].Value.int64 = 0;
                                    }
                                    std::
                                    vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                                    ::~vector(in_stack_fffffffffffff7c0);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_8 = local_30;
    }
  }
  else {
    local_30 = (adios2_varinfo *)malloc(0x28);
    sVar10 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::size
                       ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                        ((long)local_b0 + 0x20));
    local_30->nblocks = sVar10;
    local_30->Shape = (size_t *)0x0;
    paVar11 = (adios2_blockinfo *)malloc(local_30->nblocks * 0x50);
    local_30->BlocksInfo = paVar11;
    local_b8 = local_30->BlocksInfo;
    local_30->Dims = *(int *)((long)local_b0 + 0xc);
    if ((*(byte *)((long)local_b0 + 8) & 1) == 0) {
      if (*(long *)((long)local_b0 + 0x10) != 0) {
        psVar12 = (size_t *)malloc((long)*(int *)((long)local_b0 + 0xc) << 3);
        local_30->Shape = psVar12;
        memcpy(local_30->Shape,*(void **)((long)local_b0 + 0x10),
               (long)*(int *)((long)local_b0 + 0xc) << 3);
      }
    }
    else {
      psVar12 = (size_t *)malloc(8);
      local_30->Shape = psVar12;
      *local_30->Shape = *(size_t *)((long)local_b0 + 0x10);
    }
    local_30->IsValue = (uint)(*(byte *)((long)local_b0 + 0x18) & 1);
    local_30->IsReverseDims = (uint)(*(byte *)((long)local_b0 + 0x19) & 1);
    for (local_c0 = 0; pvVar5 = local_b0, local_c0 < local_30->nblocks; local_c0 = local_c0 + 1) {
      pvVar13 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                          ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                           ((long)local_b0 + 0x20),local_c0);
      local_b8[local_c0].WriterID = *(int *)pvVar13;
      pvVar13 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                          ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                           ((long)local_b0 + 0x20),local_c0);
      local_b8[local_c0].BlockID = *(size_t *)(pvVar13 + 8);
      if ((*(byte *)((long)local_b0 + 8) & 1) == 0) {
        local_b8[local_c0].Count = (size_t *)0x0;
        local_b8[local_c0].Start = (size_t *)0x0;
        pvVar13 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                  operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                             ((long)local_b0 + 0x20),local_c0);
        if (*(long *)(pvVar13 + 0x10) != 0) {
          psVar12 = (size_t *)malloc((long)*(int *)((long)local_b0 + 0xc) << 3);
          local_b8[local_c0].Start = psVar12;
          psVar12 = local_b8[local_c0].Start;
          pvVar13 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                    operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                                *)((long)local_b0 + 0x20),local_c0);
          memcpy(psVar12,*(void **)(pvVar13 + 0x10),(long)*(int *)((long)local_b0 + 0xc) << 3);
        }
        pvVar13 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                  operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                             ((long)local_b0 + 0x20),local_c0);
        if (*(long *)(pvVar13 + 0x18) != 0) {
          psVar12 = (size_t *)malloc((long)*(int *)((long)local_b0 + 0xc) << 3);
          local_b8[local_c0].Count = psVar12;
          psVar12 = local_b8[local_c0].Count;
          pvVar13 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                    operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                                *)((long)local_b0 + 0x20),local_c0);
          memcpy(psVar12,*(void **)(pvVar13 + 0x18),(long)*(int *)((long)local_b0 + 0xc) << 3);
        }
      }
      else {
        psVar12 = (size_t *)malloc(8);
        local_b8[local_c0].Start = psVar12;
        pvVar13 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                  operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                             ((long)local_b0 + 0x20),local_c0);
        *local_b8[local_c0].Start = *(size_t *)(pvVar13 + 0x10);
        psVar12 = (size_t *)malloc(8);
        local_b8[local_c0].Count = psVar12;
        pvVar13 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                  operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                             ((long)local_b0 + 0x20),local_c0);
        *local_b8[local_c0].Count = *(size_t *)(pvVar13 + 0x18);
      }
      paVar11 = local_b8;
      uVar2 = local_c0;
      if ((*(byte *)((long)local_b0 + 0x18) & 1) == 0) {
        pvVar13 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                  operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                             ((long)local_b0 + 0x20),local_c0);
        paVar4 = local_b8;
        uVar3 = local_c0;
        paVar11[uVar2].MinUnion.int64 = *(int64_t *)(pvVar13 + 0x20);
        *(undefined8 *)((long)&paVar11[uVar2].MinUnion + 8) = *(undefined8 *)(pvVar13 + 0x28);
        pvVar13 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                  operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                             ((long)local_b0 + 0x20),local_c0);
        paVar4[uVar3].MaxUnion.int64 = *(int64_t *)(pvVar13 + 0x30);
        *(undefined8 *)((long)&paVar4[uVar3].MaxUnion + 8) = *(undefined8 *)(pvVar13 + 0x38);
      }
      else {
        pvVar13 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                  operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                             ((long)local_b0 + 0x20),local_c0);
        piVar1 = *(int64_t **)(pvVar13 + 0x40);
        paVar11[uVar2].Value.int64 = *piVar1;
        *(int64_t *)((long)&paVar11[uVar2].Value + 8) = piVar1[1];
      }
    }
    if (local_b0 != (void *)0x0) {
      adios2::MinVarInfo::~MinVarInfo((MinVarInfo *)0x15ebc0);
      operator_delete(pvVar5);
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

adios2_varinfo *adios2_inquire_blockinfo(adios2_engine *engine, adios2_variable *variable,
                                         const size_t step)
{
    auto lf_CopyDims = [](const std::vector<size_t> &dims) -> size_t * {
        size_t *a = nullptr;
        size_t ndims = dims.size();
        if (ndims > 0)
        {
            a = (size_t *)malloc(dims.size() * sizeof(size_t));
            std::memcpy(a, dims.data(), dims.size() * sizeof(size_t));
        }
        return a;
    };

    adios2_varinfo *varinfo = NULL;

    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for adios2_engine, in call to adios2_inquire_blockinfo");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call "
                                                  "to adios2_get");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        const adios2::DataType type(variableBase->m_Type);

        const auto minBlocksInfo = engineCpp->MinBlocksInfo(*variableBase, step);

        if (minBlocksInfo)
        {
            varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));
            varinfo->nblocks = minBlocksInfo->BlocksInfo.size();
            varinfo->Shape = NULL;
            varinfo->BlocksInfo =
                (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));
            auto *b = varinfo->BlocksInfo;

            varinfo->Dims = minBlocksInfo->Dims;
            if (minBlocksInfo->WasLocalValue)
            {
                varinfo->Shape = (size_t *)malloc(sizeof(size_t));
                varinfo->Shape[0] = (intptr_t)minBlocksInfo->Shape;
            }
            else
            {
                if (minBlocksInfo->Shape)
                {
                    varinfo->Shape = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                    memcpy(varinfo->Shape, minBlocksInfo->Shape,
                           sizeof(size_t) * minBlocksInfo->Dims);
                }
            }
            varinfo->IsValue = (int)minBlocksInfo->IsValue;
            varinfo->IsReverseDims = (int)minBlocksInfo->IsReverseDims;
            for (size_t i = 0; i < varinfo->nblocks; ++i)
            {
                b[i].WriterID = minBlocksInfo->BlocksInfo[i].WriterID;
                b[i].BlockID = minBlocksInfo->BlocksInfo[i].BlockID;
                if (minBlocksInfo->WasLocalValue)
                {
                    b[i].Start = (size_t *)malloc(sizeof(size_t));
                    b[i].Start[0] = (intptr_t)minBlocksInfo->BlocksInfo[i].Start;
                    b[i].Count = (size_t *)malloc(sizeof(size_t));
                    b[i].Count[0] = (intptr_t)minBlocksInfo->BlocksInfo[i].Count;
                }
                else
                {
                    b[i].Start = b[i].Count = NULL;
                    if (minBlocksInfo->BlocksInfo[i].Start)
                    {
                        b[i].Start = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                        memcpy(b[i].Start, minBlocksInfo->BlocksInfo[i].Start,
                               sizeof(size_t) * minBlocksInfo->Dims);
                    }
                    if (minBlocksInfo->BlocksInfo[i].Count)
                    {
                        b[i].Count = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                        memcpy(b[i].Count, minBlocksInfo->BlocksInfo[i].Count,
                               sizeof(size_t) * minBlocksInfo->Dims);
                    }
                }
                if (minBlocksInfo->IsValue)
                {
                    memcpy(&b[i].Value, minBlocksInfo->BlocksInfo[i].BufferP, sizeof(b[i].Value));
                }
                else
                {
                    memcpy(&b[i].MinUnion, &minBlocksInfo->BlocksInfo[i].MinMax.MinUnion,
                           sizeof(b[i].MinUnion));
                    memcpy(&b[i].MaxUnion, &minBlocksInfo->BlocksInfo[i].MinMax.MaxUnion,
                           sizeof(b[i].MaxUnion));
                }
            }
            delete minBlocksInfo;
            return varinfo;
        }

        /* Call the big gun Engine::BlocksInfo<T> */
        if (type == adios2::DataType::Struct)
        {
            return varinfo;
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            const auto blocksInfo = engineCpp->BlocksInfo<std::string>(
                *dynamic_cast<adios2::core::Variable<std::string> *>(variableBase), step);
            varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));
            varinfo->nblocks = blocksInfo.size();
            varinfo->BlocksInfo =
                (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));
            auto *b = varinfo->BlocksInfo;

            varinfo->Dims = static_cast<int>(blocksInfo[0].Shape.size());
            varinfo->Shape = lf_CopyDims(blocksInfo[0].Shape);
            varinfo->IsValue = (int)blocksInfo[0].IsValue;
            varinfo->IsReverseDims = (int)blocksInfo[0].IsReverseDims;
            for (size_t i = 0; i < varinfo->nblocks; ++i)
            {
                b[i].WriterID = blocksInfo[i].WriterID;
                b[i].BlockID = blocksInfo[i].BlockID;
                b[i].Start = lf_CopyDims(blocksInfo[i].Start);
                b[i].Count = lf_CopyDims(blocksInfo[i].Count);
                // minBlocksInfo->BlocksInfo[i].MinUnion;
                b[i].MinUnion.uint64 = 0;
                // minBlocksInfo->BlocksInfo[i].MaxUnion;
                b[i].MaxUnion.uint64 = 0;
                b[i].Value.str = (char *)blocksInfo[i].Value.data();
            };
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        const auto blocksInfo = engineCpp->BlocksInfo<T>(                                          \
            *dynamic_cast<adios2::core::Variable<T> *>(variableBase), step);                       \
        varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));                                \
        varinfo->nblocks = blocksInfo.size();                                                      \
        varinfo->BlocksInfo =                                                                      \
            (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));               \
        auto *b = varinfo->BlocksInfo;                                                             \
                                                                                                   \
        varinfo->Dims = static_cast<int>(blocksInfo[0].Shape.size());                              \
        varinfo->Shape = lf_CopyDims(blocksInfo[0].Shape);                                         \
        varinfo->IsValue = (int)blocksInfo[0].IsValue;                                             \
        varinfo->IsReverseDims = (int)blocksInfo[0].IsReverseDims;                                 \
        for (size_t i = 0; i < varinfo->nblocks; ++i)                                              \
        {                                                                                          \
            b[i].WriterID = blocksInfo[i].WriterID;                                                \
            b[i].BlockID = blocksInfo[i].BlockID;                                                  \
            b[i].Start = lf_CopyDims(blocksInfo[i].Start);                                         \
            b[i].Count = lf_CopyDims(blocksInfo[i].Count);                                         \
            b[i].MinUnion.uint64 = 0;                                                              \
            b[i].MaxUnion.uint64 = 0;                                                              \
            b[i].Value.uint64 = 0;                                                                 \
        };                                                                                         \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_inquire_blockinfo");
        return NULL;
    }
    return varinfo;
}